

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deh261.c
# Opt level: O0

int main(void)

{
  int iVar1;
  h261_gob *gob_00;
  h261_gob *gob;
  h261_picparm *phStack_38;
  uint32_t start_code;
  h261_picparm *picparm;
  bitstream *str;
  int res;
  int c;
  int bytesmax;
  int bytesnum;
  uint8_t *bytes;
  
  bytes._4_4_ = 0;
  _bytesmax = (uint8_t *)0x0;
  c = 0;
  res = 0;
  while (str._4_4_ = getchar(), str._4_4_ != -1) {
    if (res <= c) {
      if (res == 0) {
        res = 0x10;
      }
      else {
        res = res << 1;
      }
      _bytesmax = (uint8_t *)realloc(_bytesmax,(long)res);
    }
    _bytesmax[c] = (uint8_t)str._4_4_;
    c = c + 1;
  }
  picparm = (h261_picparm *)vs_new_decode(VS_H261,_bytesmax,c);
  phStack_38 = (h261_picparm *)calloc(8,1);
  do {
    while (iVar1 = vs_start((bitstream *)picparm,(uint32_t *)((long)&gob + 4)), iVar1 != 0) {
LAB_00101327:
      str._0_4_ = vs_search_start((bitstream *)picparm);
      if ((int)str == -1) {
        return 1;
      }
      if ((int)str == 0) {
        return 0;
      }
      printf("\n");
    }
    printf("Start code: %02x\n",(ulong)gob._4_4_);
    if (gob._4_4_ != 0) {
      if (gob._4_4_ < 0xd) {
        gob_00 = (h261_gob *)calloc(0xc89c,1);
        gob_00->gn = gob._4_4_;
        iVar1 = h261_gob((bitstream *)picparm,gob_00);
        if (iVar1 == 0) {
          h261_print_gob(gob_00);
          h261_del_gob(gob_00);
          goto LAB_00101314;
        }
        h261_print_gob(gob_00);
        h261_del_gob(gob_00);
      }
      else {
        fprintf(_stderr,"Invalid start code %d\n",(ulong)gob._4_4_);
      }
      goto LAB_00101327;
    }
    iVar1 = h261_picparm((bitstream *)picparm,phStack_38);
    if (iVar1 != 0) goto LAB_00101327;
    h261_print_picparm(phStack_38);
LAB_00101314:
    printf("NAL decoded successfully\n\n");
  } while( true );
}

Assistant:

int main() {
	uint8_t *bytes = 0;
	int bytesnum = 0;
	int bytesmax = 0;
	int c;
	int res;
	while ((c = getchar()) != EOF) {
		ADDARRAY(bytes, c);
	}
	struct bitstream *str = vs_new_decode(VS_H261, bytes, bytesnum);
	struct h261_picparm *picparm = calloc(sizeof *picparm, 1);
	while (1) {
		uint32_t start_code;
		if (vs_start(str, &start_code)) goto err;
		printf("Start code: %02x\n", start_code);
		if (start_code == 0) {
			if (h261_picparm(str, picparm)) goto err;
			h261_print_picparm(picparm);
		} else if (start_code <= 12) {
			struct h261_gob *gob = calloc (sizeof *gob, 1);
			gob->gn = start_code;
			if (h261_gob(str, gob)) {
				h261_print_gob(gob);
				h261_del_gob(gob);
				goto err;
			}
			h261_print_gob(gob);
			h261_del_gob(gob);
		} else {
			fprintf(stderr, "Invalid start code %d\n", start_code);
			goto err;
		}
		printf("NAL decoded successfully\n\n");
		continue;
err:
		res = vs_search_start(str);
		if (res == -1)
			return 1;
		if (!res)
			break;
		printf("\n");
	}
	return 0;
}